

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O0

int __thiscall
SatPos::CalculateClkDifdot
          (SatPos *this,Ephemeris *Eph,int prn,SATTIME tsv,NavSys sys,double *ClkDifdot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  SATTIME t_now;
  double deltatr;
  double Ekdot;
  double Ek;
  double F;
  double *ClkDifdot_local;
  NavSys sys_local;
  int prn_local;
  Ephemeris *Eph_local;
  SatPos *this_local;
  SATTIME tsv_local;
  
  *ClkDifdot = 0.0;
  if (sys == GPS) {
    dVar2 = sqrt(398600500000000.0);
    Ek = ((dVar2 * -2.0) / 299792458.0) / 299792458.0;
    Ekdot = this->Gps[prn].Ek;
    deltatr = this->Gps[prn].Ekdot;
  }
  else if (sys == BDS) {
    dVar2 = sqrt(398600441800000.0);
    Ek = ((dVar2 * -2.0) / 299792458.0) / 299792458.0;
    Ekdot = this->Bds[prn].Ek;
    deltatr = this->Bds[prn].Ekdot;
  }
  dVar2 = Eph[prn].ecc;
  dVar1 = Eph[prn].sqrtA;
  dVar3 = cos(Ekdot);
  *ClkDifdot = Eph[prn].af2 * 2.0 * (tsv.SOW - Eph[prn].toc) + Eph[prn].af1 +
               Ek * dVar2 * dVar1 * dVar3 * deltatr;
  return 0;
}

Assistant:

int SatPos::CalculateClkDifdot(const Ephemeris* Eph, const int prn, const SATTIME tsv,
                               const NavSys sys, double &ClkDifdot) {
    double F, Ek, Ekdot;
    ClkDifdot = 0;
    try
    {
        if(sys == GPS){
            F = -2 * sqrt(GPSMIU) / LIGHTSPEED / LIGHTSPEED;
            Ek = Gps[prn].Ek;
            Ekdot =  Gps[prn].Ekdot;
        }
        else if(sys == BDS){
            F = -2 * sqrt(BDSMIU) / LIGHTSPEED / LIGHTSPEED;
            Ek = Bds[prn].Ek;
            Ekdot = Bds[prn].Ekdot;
        }
    }
    catch(...)
    {
        cout << "error happened when calculation satellite clock difference" << endl;
        return UNKNOWN_ERROR;
    }
    double deltatr = F * Eph[prn].ecc * Eph[prn].sqrtA * cos(Ek) * Ekdot;
    SATTIME t_now = tsv;
    ClkDifdot = Eph[prn].af1 + 2 * Eph[prn].af2 * (t_now.SOW - Eph[prn].toc) + deltatr; 

    return 0;
}